

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_16_2_164db4ee comp)

{
  int iVar1;
  bool bVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  reference piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this;
  difference_type dVar5;
  T tmp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> sift;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cur;
  size_t limit;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  int local_4c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  anon_class_16_2_164db4ee *this_00;
  
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
  if (!bVar2) {
    this_00 = (anon_class_16_2_164db4ee *)0x0;
    _Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              in_stack_ffffffffffffff88), local_40._M_current = _Var3._M_current,
          bVar2) {
      _Var3._M_current = local_40._M_current;
      local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator-((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_40);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_48);
      bVar2 = HighsSymmetryDetection::computeComponentData::anon_class_16_2_164db4ee::operator()
                        (this_00,(HighsInt)((ulong)_Var3._M_current >> 0x20),
                         (HighsInt)_Var3._M_current);
      if (bVar2) {
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_40);
        local_4c = *piVar4;
        do {
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          iVar1 = *piVar4;
          local_58 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator--((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                in_stack_ffffffffffffff94);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_58);
          *piVar4 = iVar1;
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
          if (bVar2) {
            in_stack_ffffffffffffff98 = local_4c;
            this = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator--(&local_48);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (this);
            bVar2 = HighsSymmetryDetection::computeComponentData::anon_class_16_2_164db4ee::
                    operator()(this_00,(HighsInt)((ulong)_Var3._M_current >> 0x20),
                               (HighsInt)_Var3._M_current);
            in_stack_ffffffffffffff9c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff9c);
          }
        } while ((char)(in_stack_ffffffffffffff9c >> 0x18) != '\0');
        in_stack_ffffffffffffff94 = local_4c;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_40);
        *piVar4 = in_stack_ffffffffffffff94;
        dVar5 = __gnu_cxx::operator-
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        this_00 = (anon_class_16_2_164db4ee *)((long)&this_00->componentData + dVar5);
      }
      if ((anon_class_16_2_164db4ee *)0x8 < this_00) {
        return false;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffc8);
    }
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }